

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropulsionSystem.h
# Opt level: O0

PropulsionSystem * __thiscall
KDIS::DATA_TYPE::PropulsionSystem::operator=(PropulsionSystem *this,PropulsionSystem *param_1)

{
  KFLOAT32 KVar1;
  PropulsionSystem *param_1_local;
  PropulsionSystem *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KVar1 = param_1->m_f32EngineRPM;
  this->m_f32PowerSetting = param_1->m_f32PowerSetting;
  this->m_f32EngineRPM = KVar1;
  return this;
}

Assistant:

class KDIS_EXPORT PropulsionSystem : public DataTypeBase
{
protected:

    KFLOAT32 m_f32PowerSetting;

    KFLOAT32 m_f32EngineRPM;

public:

    static const KUINT16 PROPULSION_SYSTEM_SIZE = 8;

    PropulsionSystem();

    PropulsionSystem(KDataStream &stream) noexcept(false);

    PropulsionSystem( KFLOAT32 PowerSetting, KFLOAT32 EngineRPM );

    virtual ~PropulsionSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::PropulsionSystem::SetPowerSetting
    //              KDIS::DATA_TYPE::PropulsionSystem::GetPowerSetting
    // Description: The power settings after any response lags have been incorprated.
    // Parameter:   KFLOAT32 PS, PowerSetting PS
    //************************************
    void SetPowerSetting( KFLOAT32 PS );
    void SetPowerSetting( KDIS::DATA_TYPE::ENUMS::PowerSettingAircraft PS );
    void SetPowerSetting( KDIS::DATA_TYPE::ENUMS::PowerSettingHelicopter PS );
    void SetPowerSetting( KDIS::DATA_TYPE::ENUMS::ActiveEmissionParameterIndex PS );
    KFLOAT32 GetPowerSetting() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PropulsionSystem::SetEngineRPM
    //              KDIS::DATA_TYPE::PropulsionSystem::GetEngineRPM
    // Description: Current engine speed in RPM
    // Parameter:   KFLOAT32 RPM, void
    //************************************
    void SetEngineRPM( KFLOAT32 RPM );
    KFLOAT32 GetEngineRPM() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PropulsionSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PropulsionSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::PropulsionSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const PropulsionSystem & Value ) const;
    KBOOL operator != ( const PropulsionSystem & Value ) const;
}